

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinUpdateFunction<duckdb::HistogramFunctor,double,duckdb::HistogramExact>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  pointer puVar1;
  HistogramBinState<double> *this;
  idx_t iVar2;
  idx_t iVar3;
  unsafe_vector<double> *bin_boundaries;
  idx_t i;
  idx_t pos;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(inputs,count,&local_c0);
  for (pos = 0; count != pos; pos = pos + 1) {
    iVar3 = pos;
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)(local_c0.sel)->sel_vector[pos];
    }
    if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6] >>
         (iVar3 & 0x3f) & 1) != 0)) {
      iVar2 = pos;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)(local_78.sel)->sel_vector[pos];
      }
      this = *(HistogramBinState<double> **)(local_78.data + iVar2 * 8);
      bin_boundaries = this->bin_boundaries;
      if (bin_boundaries == (unsafe_vector<double> *)0x0) {
        HistogramBinState<double>::InitializeBins<duckdb::HistogramFunctor>
                  (this,inputs + 1,count,pos,aggr_input);
        bin_boundaries = this->bin_boundaries;
      }
      iVar3 = HistogramExact::GetBin<double>(*(double *)(local_c0.data + iVar3 * 8),bin_boundaries);
      puVar1 = (this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      *puVar1 = *puVar1 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}